

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O1

QMimeType __thiscall
QMimeDatabase::mimeTypeForFileNameAndData(QMimeDatabase *this,QString *fileName,QIODevice *device)

{
  __pointer_type copy;
  long lVar1;
  long lVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (fileName->d).d;
  lVar2._0_4_ = pDVar3[4].super_QArrayData.ref_;
  lVar2._4_4_ = pDVar3[4].super_QArrayData.flags;
  pDVar3 = pDVar3 + 4;
  if (lVar2 == 0) {
    LOCK();
    bVar4 = (((AtomicType *)&(pDVar3->super_QArrayData).ref_)->_M_b)._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (((AtomicType *)&(pDVar3->super_QArrayData).ref_)->_M_b)._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar4) goto LAB_004b32cd;
  }
  QBasicMutex::lockInternal((QBasicMutex *)pDVar3);
LAB_004b32cd:
  bVar4 = QString::endsWith((QString *)device,(QChar)0x2f,CaseSensitive);
  if (bVar4) {
    QMimeDatabasePrivate::mimeTypeForName((QMimeDatabasePrivate *)this,(QString *)(fileName->d).d);
  }
  else {
    this->d = (QMimeDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QMimeDatabasePrivate::mimeTypeForFileNameAndData
              ((QMimeDatabasePrivate *)this,(QString *)(fileName->d).d,device);
  }
  LOCK();
  copy = (((AtomicType *)&(pDVar3->super_QArrayData).ref_)->_M_b)._M_p;
  (((AtomicType *)&(pDVar3->super_QArrayData).ref_)->_M_b)._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)pDVar3,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QMimeTypePrivate>)
           (QExplicitlySharedDataPointer<QMimeTypePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QMimeType QMimeDatabase::mimeTypeForFileNameAndData(const QString &fileName, QIODevice *device) const
{
    QMutexLocker locker(&d->mutex);

    if (fileName.endsWith(u'/'))
        return d->mimeTypeForName(directoryMimeType());

    const QMimeType result = d->mimeTypeForFileNameAndData(fileName, device);
    return result;
}